

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ulong uVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  NodeRef *pNVar36;
  ulong uVar37;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  NodeRef *local_b20;
  undefined1 local_a98 [16];
  undefined1 (*local_a80) [16];
  long local_a78;
  long local_a70;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  undefined1 auVar95 [64];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar74._4_4_ = uVar1;
  auVar74._0_4_ = uVar1;
  auVar74._8_4_ = uVar1;
  auVar74._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar79._4_4_ = uVar1;
  auVar79._0_4_ = uVar1;
  auVar79._8_4_ = uVar1;
  auVar79._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar86._4_4_ = uVar1;
  auVar86._0_4_ = uVar1;
  auVar86._8_4_ = uVar1;
  auVar86._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar27 = fVar2 * 0.99999964;
  fVar28 = fVar3 * 0.99999964;
  fVar29 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar5 = (tray->tnear).field_0.i[k];
  auVar99._4_4_ = iVar5;
  auVar99._0_4_ = iVar5;
  auVar99._8_4_ = iVar5;
  auVar99._12_4_ = iVar5;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar102._4_4_ = iVar5;
  auVar102._0_4_ = iVar5;
  auVar102._8_4_ = iVar5;
  auVar102._12_4_ = iVar5;
  local_a80 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_b20 = stack + 1;
LAB_01579953:
  do {
    pNVar36 = local_b20;
    if (pNVar36 == stack) {
LAB_0157a36c:
      return pNVar36 != stack;
    }
    local_b20 = pNVar36 + -1;
    sVar39 = pNVar36[-1].ptr;
    while ((sVar39 & 8) == 0) {
      uVar31 = sVar39 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar41._4_4_ = uVar1;
      auVar41._0_4_ = uVar1;
      auVar41._8_4_ = uVar1;
      auVar41._12_4_ = uVar1;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar38),auVar41,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar38));
      auVar42 = vsubps_avx(auVar42,auVar74);
      auVar47._0_4_ = fVar27 * auVar42._0_4_;
      auVar47._4_4_ = fVar27 * auVar42._4_4_;
      auVar47._8_4_ = fVar27 * auVar42._8_4_;
      auVar47._12_4_ = fVar27 * auVar42._12_4_;
      auVar42 = vmaxps_avx(auVar99,auVar47);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar34),auVar41,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar34));
      auVar47 = vsubps_avx(auVar47,auVar79);
      auVar54._0_4_ = fVar28 * auVar47._0_4_;
      auVar54._4_4_ = fVar28 * auVar47._4_4_;
      auVar54._8_4_ = fVar28 * auVar47._8_4_;
      auVar54._12_4_ = fVar28 * auVar47._12_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar40),auVar41,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar40));
      auVar47 = vsubps_avx(auVar47,auVar86);
      auVar61._0_4_ = fVar29 * auVar47._0_4_;
      auVar61._4_4_ = fVar29 * auVar47._4_4_;
      auVar61._8_4_ = fVar29 * auVar47._8_4_;
      auVar61._12_4_ = fVar29 * auVar47._12_4_;
      auVar47 = vmaxps_avx(auVar54,auVar61);
      auVar42 = vmaxps_avx(auVar42,auVar47);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar38 ^ 0x10)),auVar41,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar38 ^ 0x10)));
      auVar47 = vsubps_avx(auVar47,auVar74);
      auVar55._0_4_ = fVar2 * auVar47._0_4_;
      auVar55._4_4_ = fVar2 * auVar47._4_4_;
      auVar55._8_4_ = fVar2 * auVar47._8_4_;
      auVar55._12_4_ = fVar2 * auVar47._12_4_;
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar34 ^ 0x10)),auVar41,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar34 ^ 0x10)));
      auVar47 = vminps_avx(auVar102,auVar55);
      auVar54 = vsubps_avx(auVar54,auVar79);
      auVar62._0_4_ = fVar3 * auVar54._0_4_;
      auVar62._4_4_ = fVar3 * auVar54._4_4_;
      auVar62._8_4_ = fVar3 * auVar54._8_4_;
      auVar62._12_4_ = fVar3 * auVar54._12_4_;
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar40 ^ 0x10)),auVar41,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar40 ^ 0x10)));
      auVar54 = vsubps_avx(auVar54,auVar86);
      auVar66._0_4_ = fVar4 * auVar54._0_4_;
      auVar66._4_4_ = fVar4 * auVar54._4_4_;
      auVar66._8_4_ = fVar4 * auVar54._8_4_;
      auVar66._12_4_ = fVar4 * auVar54._12_4_;
      auVar54 = vminps_avx(auVar62,auVar66);
      auVar47 = vminps_avx(auVar47,auVar54);
      if (((uint)sVar39 & 7) == 6) {
        auVar47 = vcmpps_avx(auVar42,auVar47,2);
        auVar42 = vcmpps_avx(*(undefined1 (*) [16])(uVar31 + 0xe0),auVar41,2);
        auVar54 = vcmpps_avx(auVar41,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
        auVar42 = vandps_avx(auVar42,auVar54);
        auVar42 = vandps_avx(auVar42,auVar47);
      }
      else {
        auVar42 = vcmpps_avx(auVar42,auVar47,2);
      }
      auVar42 = vpslld_avx(auVar42,0x1f);
      uVar32 = vmovmskps_avx(auVar42);
      if (uVar32 == 0) goto LAB_01579953;
      uVar32 = uVar32 & 0xff;
      lVar33 = 0;
      for (uVar35 = (ulong)uVar32; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar33 = lVar33 + 1;
      }
      sVar39 = *(size_t *)(uVar31 + lVar33 * 8);
      uVar32 = uVar32 - 1 & uVar32;
      uVar35 = (ulong)uVar32;
      if (uVar32 != 0) {
        do {
          local_b20->ptr = sVar39;
          local_b20 = local_b20 + 1;
          lVar33 = 0;
          for (uVar30 = uVar35; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar33 = lVar33 + 1;
          }
          uVar35 = uVar35 - 1 & uVar35;
          sVar39 = *(size_t *)(uVar31 + lVar33 * 8);
        } while (uVar35 != 0);
      }
    }
    local_a70 = (ulong)((uint)sVar39 & 0xf) - 8;
    uVar31 = sVar39 & 0xfffffffffffffff0;
    for (local_a78 = 0; local_a78 != local_a70; local_a78 = local_a78 + 1) {
      lVar33 = local_a78 * 0x140;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar67._4_4_ = uVar1;
      auVar67._0_4_ = uVar1;
      auVar67._8_4_ = uVar1;
      auVar67._12_4_ = uVar1;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x90 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + lVar33));
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xa0 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x10 + lVar33));
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xb0 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + lVar33));
      auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xc0 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x30 + lVar33));
      auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xd0 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x40 + lVar33));
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xe0 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x50 + lVar33));
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xf0 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x60 + lVar33));
      auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x100 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x70 + lVar33));
      auVar67 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x110 + lVar33),auVar67,
                                *(undefined1 (*) [16])(uVar31 + 0x80 + lVar33));
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar68._4_4_ = uVar1;
      auVar68._0_4_ = uVar1;
      auVar68._8_4_ = uVar1;
      auVar68._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar97._4_4_ = uVar1;
      auVar97._0_4_ = uVar1;
      auVar97._8_4_ = uVar1;
      auVar97._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar100._4_4_ = uVar1;
      auVar100._0_4_ = uVar1;
      auVar100._8_4_ = uVar1;
      auVar100._12_4_ = uVar1;
      auVar41 = vsubps_avx(auVar42,auVar68);
      auVar55 = vsubps_avx(auVar47,auVar97);
      auVar42 = vsubps_avx(auVar54,auVar100);
      auVar47 = vsubps_avx(auVar61,auVar68);
      auVar54 = vsubps_avx(auVar62,auVar97);
      auVar61 = vsubps_avx(auVar66,auVar100);
      auVar62 = vsubps_avx(auVar49,auVar68);
      auVar66 = vsubps_avx(auVar72,auVar97);
      auVar49 = vsubps_avx(auVar67,auVar100);
      auVar72 = vsubps_avx(auVar62,auVar41);
      auVar67 = vsubps_avx(auVar66,auVar55);
      auVar68 = vsubps_avx(auVar49,auVar42);
      auVar43._0_4_ = auVar62._0_4_ + auVar41._0_4_;
      auVar43._4_4_ = auVar62._4_4_ + auVar41._4_4_;
      auVar43._8_4_ = auVar62._8_4_ + auVar41._8_4_;
      auVar43._12_4_ = auVar62._12_4_ + auVar41._12_4_;
      auVar63._0_4_ = auVar66._0_4_ + auVar55._0_4_;
      auVar63._4_4_ = auVar66._4_4_ + auVar55._4_4_;
      auVar63._8_4_ = auVar66._8_4_ + auVar55._8_4_;
      auVar63._12_4_ = auVar66._12_4_ + auVar55._12_4_;
      fVar11 = auVar42._0_4_;
      auVar69._0_4_ = auVar49._0_4_ + fVar11;
      fVar12 = auVar42._4_4_;
      auVar69._4_4_ = auVar49._4_4_ + fVar12;
      fVar13 = auVar42._8_4_;
      auVar69._8_4_ = auVar49._8_4_ + fVar13;
      fVar14 = auVar42._12_4_;
      auVar69._12_4_ = auVar49._12_4_ + fVar14;
      auVar98._0_4_ = auVar68._0_4_ * auVar63._0_4_;
      auVar98._4_4_ = auVar68._4_4_ * auVar63._4_4_;
      auVar98._8_4_ = auVar68._8_4_ * auVar63._8_4_;
      auVar98._12_4_ = auVar68._12_4_ * auVar63._12_4_;
      auVar97 = vfmsub231ps_fma(auVar98,auVar67,auVar69);
      auVar70._0_4_ = auVar69._0_4_ * auVar72._0_4_;
      auVar70._4_4_ = auVar69._4_4_ * auVar72._4_4_;
      auVar70._8_4_ = auVar69._8_4_ * auVar72._8_4_;
      auVar70._12_4_ = auVar69._12_4_ * auVar72._12_4_;
      auVar69 = vfmsub231ps_fma(auVar70,auVar68,auVar43);
      auVar44._0_4_ = auVar67._0_4_ * auVar43._0_4_;
      auVar44._4_4_ = auVar67._4_4_ * auVar43._4_4_;
      auVar44._8_4_ = auVar67._8_4_ * auVar43._8_4_;
      auVar44._12_4_ = auVar67._12_4_ * auVar43._12_4_;
      auVar43 = vfmsub231ps_fma(auVar44,auVar72,auVar63);
      fVar6 = *(float *)(ray + k * 4 + 0x60);
      auVar92._0_4_ = auVar43._0_4_ * fVar6;
      auVar92._4_4_ = auVar43._4_4_ * fVar6;
      auVar92._8_4_ = auVar43._8_4_ * fVar6;
      auVar92._12_4_ = auVar43._12_4_ * fVar6;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar96._4_4_ = uVar1;
      auVar96._0_4_ = uVar1;
      auVar96._8_4_ = uVar1;
      auVar96._12_4_ = uVar1;
      auVar69 = vfmadd231ps_fma(auVar92,auVar96,auVar69);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar101._4_4_ = uVar1;
      auVar101._0_4_ = uVar1;
      auVar101._8_4_ = uVar1;
      auVar101._12_4_ = uVar1;
      auVar63 = vfmadd231ps_fma(auVar69,auVar101,auVar97);
      auVar69 = vsubps_avx(auVar55,auVar54);
      auVar97 = vsubps_avx(auVar42,auVar61);
      auVar64._0_4_ = auVar55._0_4_ + auVar54._0_4_;
      auVar64._4_4_ = auVar55._4_4_ + auVar54._4_4_;
      auVar64._8_4_ = auVar55._8_4_ + auVar54._8_4_;
      auVar64._12_4_ = auVar55._12_4_ + auVar54._12_4_;
      auVar42._0_4_ = fVar11 + auVar61._0_4_;
      auVar42._4_4_ = fVar12 + auVar61._4_4_;
      auVar42._8_4_ = fVar13 + auVar61._8_4_;
      auVar42._12_4_ = fVar14 + auVar61._12_4_;
      fVar15 = auVar97._0_4_;
      auVar80._0_4_ = auVar64._0_4_ * fVar15;
      fVar18 = auVar97._4_4_;
      auVar80._4_4_ = auVar64._4_4_ * fVar18;
      fVar21 = auVar97._8_4_;
      auVar80._8_4_ = auVar64._8_4_ * fVar21;
      fVar24 = auVar97._12_4_;
      auVar80._12_4_ = auVar64._12_4_ * fVar24;
      auVar44 = vfmsub231ps_fma(auVar80,auVar69,auVar42);
      auVar43 = vsubps_avx(auVar41,auVar47);
      fVar16 = auVar43._0_4_;
      auVar71._0_4_ = auVar42._0_4_ * fVar16;
      fVar19 = auVar43._4_4_;
      auVar71._4_4_ = auVar42._4_4_ * fVar19;
      fVar22 = auVar43._8_4_;
      auVar71._8_4_ = auVar42._8_4_ * fVar22;
      fVar25 = auVar43._12_4_;
      auVar71._12_4_ = auVar42._12_4_ * fVar25;
      auVar88._0_4_ = auVar41._0_4_ + auVar47._0_4_;
      auVar88._4_4_ = auVar41._4_4_ + auVar47._4_4_;
      auVar88._8_4_ = auVar41._8_4_ + auVar47._8_4_;
      auVar88._12_4_ = auVar41._12_4_ + auVar47._12_4_;
      auVar42 = vfmsub231ps_fma(auVar71,auVar97,auVar88);
      fVar17 = auVar69._0_4_;
      auVar89._0_4_ = auVar88._0_4_ * fVar17;
      fVar20 = auVar69._4_4_;
      auVar89._4_4_ = auVar88._4_4_ * fVar20;
      fVar23 = auVar69._8_4_;
      auVar89._8_4_ = auVar88._8_4_ * fVar23;
      fVar26 = auVar69._12_4_;
      auVar89._12_4_ = auVar88._12_4_ * fVar26;
      auVar64 = vfmsub231ps_fma(auVar89,auVar43,auVar64);
      auVar65._0_4_ = auVar64._0_4_ * fVar6;
      auVar65._4_4_ = auVar64._4_4_ * fVar6;
      auVar65._8_4_ = auVar64._8_4_ * fVar6;
      auVar65._12_4_ = auVar64._12_4_ * fVar6;
      auVar42 = vfmadd231ps_fma(auVar65,auVar96,auVar42);
      auVar64 = vfmadd231ps_fma(auVar42,auVar101,auVar44);
      auVar44 = vsubps_avx(auVar47,auVar62);
      auVar56._0_4_ = auVar47._0_4_ + auVar62._0_4_;
      auVar56._4_4_ = auVar47._4_4_ + auVar62._4_4_;
      auVar56._8_4_ = auVar47._8_4_ + auVar62._8_4_;
      auVar56._12_4_ = auVar47._12_4_ + auVar62._12_4_;
      auVar62 = vsubps_avx(auVar54,auVar66);
      auVar48._0_4_ = auVar54._0_4_ + auVar66._0_4_;
      auVar48._4_4_ = auVar54._4_4_ + auVar66._4_4_;
      auVar48._8_4_ = auVar54._8_4_ + auVar66._8_4_;
      auVar48._12_4_ = auVar54._12_4_ + auVar66._12_4_;
      auVar66 = vsubps_avx(auVar61,auVar49);
      auVar75._0_4_ = auVar61._0_4_ + auVar49._0_4_;
      auVar75._4_4_ = auVar61._4_4_ + auVar49._4_4_;
      auVar75._8_4_ = auVar61._8_4_ + auVar49._8_4_;
      auVar75._12_4_ = auVar61._12_4_ + auVar49._12_4_;
      auVar81._0_4_ = auVar66._0_4_ * auVar48._0_4_;
      auVar81._4_4_ = auVar66._4_4_ * auVar48._4_4_;
      auVar81._8_4_ = auVar66._8_4_ * auVar48._8_4_;
      auVar81._12_4_ = auVar66._12_4_ * auVar48._12_4_;
      auVar47 = vfmsub231ps_fma(auVar81,auVar62,auVar75);
      auVar76._0_4_ = auVar75._0_4_ * auVar44._0_4_;
      auVar76._4_4_ = auVar75._4_4_ * auVar44._4_4_;
      auVar76._8_4_ = auVar75._8_4_ * auVar44._8_4_;
      auVar76._12_4_ = auVar75._12_4_ * auVar44._12_4_;
      auVar42 = vfmsub231ps_fma(auVar76,auVar66,auVar56);
      auVar57._0_4_ = auVar62._0_4_ * auVar56._0_4_;
      auVar57._4_4_ = auVar62._4_4_ * auVar56._4_4_;
      auVar57._8_4_ = auVar62._8_4_ * auVar56._8_4_;
      auVar57._12_4_ = auVar62._12_4_ * auVar56._12_4_;
      auVar54 = vfmsub231ps_fma(auVar57,auVar44,auVar48);
      auVar49._0_4_ = auVar54._0_4_ * fVar6;
      auVar49._4_4_ = auVar54._4_4_ * fVar6;
      auVar49._8_4_ = auVar54._8_4_ * fVar6;
      auVar49._12_4_ = auVar54._12_4_ * fVar6;
      auVar42 = vfmadd231ps_fma(auVar49,auVar96,auVar42);
      auVar61 = vfmadd231ps_fma(auVar42,auVar101,auVar47);
      auVar87._0_4_ = auVar61._0_4_ + auVar63._0_4_ + auVar64._0_4_;
      auVar87._4_4_ = auVar61._4_4_ + auVar63._4_4_ + auVar64._4_4_;
      auVar87._8_4_ = auVar61._8_4_ + auVar63._8_4_ + auVar64._8_4_;
      auVar87._12_4_ = auVar61._12_4_ + auVar63._12_4_ + auVar64._12_4_;
      auVar58._8_4_ = 0x7fffffff;
      auVar58._0_8_ = 0x7fffffff7fffffff;
      auVar58._12_4_ = 0x7fffffff;
      auVar42 = vminps_avx(auVar63,auVar64);
      auVar47 = vminps_avx(auVar42,auVar61);
      auVar42 = vandps_avx(auVar87,auVar58);
      auVar90._0_4_ = auVar42._0_4_ * 1.1920929e-07;
      auVar90._4_4_ = auVar42._4_4_ * 1.1920929e-07;
      auVar90._8_4_ = auVar42._8_4_ * 1.1920929e-07;
      auVar90._12_4_ = auVar42._12_4_ * 1.1920929e-07;
      uVar35 = CONCAT44(auVar90._4_4_,auVar90._0_4_);
      auVar82._0_8_ = uVar35 ^ 0x8000000080000000;
      auVar82._8_4_ = -auVar90._8_4_;
      auVar82._12_4_ = -auVar90._12_4_;
      auVar47 = vcmpps_avx(auVar47,auVar82,5);
      auVar54 = vmaxps_avx(auVar63,auVar64);
      auVar54 = vmaxps_avx(auVar54,auVar61);
      auVar54 = vcmpps_avx(auVar54,auVar90,2);
      auVar47 = vorps_avx(auVar47,auVar54);
      if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0'
         ) {
        auVar50._0_4_ = auVar68._0_4_ * fVar17;
        auVar50._4_4_ = auVar68._4_4_ * fVar20;
        auVar50._8_4_ = auVar68._8_4_ * fVar23;
        auVar50._12_4_ = auVar68._12_4_ * fVar26;
        auVar77._0_4_ = fVar16 * auVar67._0_4_;
        auVar77._4_4_ = fVar19 * auVar67._4_4_;
        auVar77._8_4_ = fVar22 * auVar67._8_4_;
        auVar77._12_4_ = fVar25 * auVar67._12_4_;
        auVar49 = vfmsub213ps_fma(auVar67,auVar97,auVar50);
        auVar83._0_4_ = auVar62._0_4_ * fVar15;
        auVar83._4_4_ = auVar62._4_4_ * fVar18;
        auVar83._8_4_ = auVar62._8_4_ * fVar21;
        auVar83._12_4_ = auVar62._12_4_ * fVar24;
        auVar91._0_4_ = fVar16 * auVar66._0_4_;
        auVar91._4_4_ = fVar19 * auVar66._4_4_;
        auVar91._8_4_ = fVar22 * auVar66._8_4_;
        auVar91._12_4_ = fVar25 * auVar66._12_4_;
        auVar66 = vfmsub213ps_fma(auVar66,auVar69,auVar83);
        auVar54 = vandps_avx(auVar50,auVar58);
        auVar61 = vandps_avx(auVar83,auVar58);
        auVar54 = vcmpps_avx(auVar54,auVar61,1);
        local_898 = vblendvps_avx(auVar66,auVar49,auVar54);
        auVar84._0_4_ = auVar44._0_4_ * fVar17;
        auVar84._4_4_ = auVar44._4_4_ * fVar20;
        auVar84._8_4_ = auVar44._8_4_ * fVar23;
        auVar84._12_4_ = auVar44._12_4_ * fVar26;
        auVar66 = vfmsub213ps_fma(auVar44,auVar97,auVar91);
        auVar51._0_4_ = auVar72._0_4_ * fVar15;
        auVar51._4_4_ = auVar72._4_4_ * fVar18;
        auVar51._8_4_ = auVar72._8_4_ * fVar21;
        auVar51._12_4_ = auVar72._12_4_ * fVar24;
        auVar49 = vfmsub213ps_fma(auVar68,auVar43,auVar51);
        auVar54 = vandps_avx(auVar51,auVar58);
        auVar61 = vandps_avx(auVar91,auVar58);
        auVar54 = vcmpps_avx(auVar54,auVar61,1);
        local_888 = vblendvps_avx(auVar66,auVar49,auVar54);
        auVar66 = vfmsub213ps_fma(auVar72,auVar69,auVar77);
        auVar62 = vfmsub213ps_fma(auVar62,auVar43,auVar84);
        auVar54 = vandps_avx(auVar77,auVar58);
        auVar61 = vandps_avx(auVar84,auVar58);
        auVar54 = vcmpps_avx(auVar54,auVar61,1);
        local_878 = vblendvps_avx(auVar62,auVar66,auVar54);
        auVar72._0_4_ = local_878._0_4_ * fVar6;
        auVar72._4_4_ = local_878._4_4_ * fVar6;
        auVar72._8_4_ = local_878._8_4_ * fVar6;
        auVar72._12_4_ = local_878._12_4_ * fVar6;
        auVar54 = vfmadd213ps_fma(auVar96,local_888,auVar72);
        auVar54 = vfmadd213ps_fma(auVar101,local_898,auVar54);
        auVar78._0_4_ = auVar54._0_4_ + auVar54._0_4_;
        auVar78._4_4_ = auVar54._4_4_ + auVar54._4_4_;
        auVar78._8_4_ = auVar54._8_4_ + auVar54._8_4_;
        auVar78._12_4_ = auVar54._12_4_ + auVar54._12_4_;
        auVar73._0_4_ = local_878._0_4_ * fVar11;
        auVar73._4_4_ = local_878._4_4_ * fVar12;
        auVar73._8_4_ = local_878._8_4_ * fVar13;
        auVar73._12_4_ = local_878._12_4_ * fVar14;
        auVar54 = vfmadd213ps_fma(auVar55,local_888,auVar73);
        auVar41 = vfmadd213ps_fma(auVar41,local_898,auVar54);
        auVar54 = vrcpps_avx(auVar78);
        auVar93._8_4_ = 0x3f800000;
        auVar93._0_8_ = 0x3f8000003f800000;
        auVar93._12_4_ = 0x3f800000;
        auVar55 = vfnmadd213ps_fma(auVar54,auVar78,auVar93);
        auVar54 = vfmadd132ps_fma(auVar55,auVar54,auVar54);
        local_8a8._0_4_ = auVar54._0_4_ * (auVar41._0_4_ + auVar41._0_4_);
        local_8a8._4_4_ = auVar54._4_4_ * (auVar41._4_4_ + auVar41._4_4_);
        local_8a8._8_4_ = auVar54._8_4_ * (auVar41._8_4_ + auVar41._8_4_);
        local_8a8._12_4_ = auVar54._12_4_ * (auVar41._12_4_ + auVar41._12_4_);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar85._4_4_ = uVar1;
        auVar85._0_4_ = uVar1;
        auVar85._8_4_ = uVar1;
        auVar85._12_4_ = uVar1;
        auVar54 = vcmpps_avx(auVar85,local_8a8,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar94._4_4_ = uVar1;
        auVar94._0_4_ = uVar1;
        auVar94._8_4_ = uVar1;
        auVar94._12_4_ = uVar1;
        auVar95 = ZEXT1664(auVar94);
        auVar41 = vcmpps_avx(local_8a8,auVar94,2);
        auVar54 = vandps_avx(auVar41,auVar54);
        auVar41 = auVar47 & auVar54;
        if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar41[0xf] < '\0') {
          auVar47 = vandps_avx(auVar47,auVar54);
          auVar54 = vcmpps_avx(auVar78,_DAT_01f45a50,4);
          auVar47 = vandps_avx(auVar47,auVar54);
          uVar32 = vmovmskps_avx(auVar47);
          if (uVar32 != 0) {
            pSVar8 = context->scene;
            auVar47 = vrcpps_avx(auVar87);
            auVar59._8_4_ = 0x3f800000;
            auVar59._0_8_ = 0x3f8000003f800000;
            auVar59._12_4_ = 0x3f800000;
            auVar54 = vfnmadd213ps_fma(auVar87,auVar47,auVar59);
            auVar47 = vfmadd132ps_fma(auVar54,auVar47,auVar47);
            auVar52._8_4_ = 0x219392ef;
            auVar52._0_8_ = 0x219392ef219392ef;
            auVar52._12_4_ = 0x219392ef;
            auVar42 = vcmpps_avx(auVar42,auVar52,5);
            auVar42 = vandps_avx(auVar42,auVar47);
            auVar45._0_4_ = auVar63._0_4_ * auVar42._0_4_;
            auVar45._4_4_ = auVar63._4_4_ * auVar42._4_4_;
            auVar45._8_4_ = auVar63._8_4_ * auVar42._8_4_;
            auVar45._12_4_ = auVar63._12_4_ * auVar42._12_4_;
            local_8c8 = vminps_avx(auVar45,auVar59);
            auVar46._0_4_ = auVar42._0_4_ * auVar64._0_4_;
            auVar46._4_4_ = auVar42._4_4_ * auVar64._4_4_;
            auVar46._8_4_ = auVar42._8_4_ * auVar64._8_4_;
            auVar46._12_4_ = auVar42._12_4_ * auVar64._12_4_;
            local_8b8 = vminps_avx(auVar46,auVar59);
            uVar35 = (ulong)(uVar32 & 0xff);
            do {
              uVar30 = 0;
              for (uVar37 = uVar35; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                uVar30 = uVar30 + 1;
              }
              uVar32 = *(uint *)(lVar33 + uVar31 + 0x120 + uVar30 * 4);
              pGVar9 = (pSVar8->geometries).items[uVar32].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar37 = (ulong)(uint)((int)uVar30 * 4);
                  local_838 = *(undefined4 *)(local_8c8 + uVar37);
                  uVar1 = *(undefined4 *)(local_8b8 + uVar37);
                  local_828._4_4_ = uVar1;
                  local_828._0_4_ = uVar1;
                  local_828._8_4_ = uVar1;
                  local_828._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar37);
                  args.context = context->user;
                  local_808._4_4_ = uVar32;
                  local_808._0_4_ = uVar32;
                  local_808._8_4_ = uVar32;
                  local_808._12_4_ = uVar32;
                  uVar1 = *(undefined4 *)(lVar33 + uVar31 + 0x130 + uVar37);
                  local_818._4_4_ = uVar1;
                  local_818._0_4_ = uVar1;
                  local_818._8_4_ = uVar1;
                  local_818._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_898 + uVar37);
                  uVar7 = *(undefined4 *)(local_888 + uVar37);
                  local_858._4_4_ = uVar7;
                  local_858._0_4_ = uVar7;
                  local_858._8_4_ = uVar7;
                  local_858._12_4_ = uVar7;
                  uVar7 = *(undefined4 *)(local_878 + uVar37);
                  local_848._4_4_ = uVar7;
                  local_848._0_4_ = uVar7;
                  local_848._8_4_ = uVar7;
                  local_848._12_4_ = uVar7;
                  local_868[0] = (RTCHitN)(char)uVar1;
                  local_868[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar1;
                  local_868[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar1;
                  local_868[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar1;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  local_a98 = *local_a80;
                  args.valid = (int *)local_a98;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  auVar42 = auVar95._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&args);
                    auVar95 = ZEXT1664(auVar42);
                  }
                  if (local_a98 == (undefined1  [16])0x0) {
                    auVar42 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar42 = auVar42 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                      auVar95 = ZEXT1664(auVar42);
                    }
                    auVar47 = vpcmpeqd_avx(local_a98,_DAT_01f45a50);
                    auVar42 = auVar47 ^ _DAT_01f46b70;
                    auVar60._8_4_ = 0xff800000;
                    auVar60._0_8_ = 0xff800000ff800000;
                    auVar60._12_4_ = 0xff800000;
                    auVar47 = vblendvps_avx(auVar60,*(undefined1 (*) [16])(args.ray + 0x80),auVar47)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar47;
                  }
                  auVar53._8_8_ = 0x100000001;
                  auVar53._0_8_ = 0x100000001;
                  if ((auVar53 & auVar42) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar95._0_4_;
                    goto LAB_0157a27d;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_0157a36c;
              }
LAB_0157a27d:
              uVar35 = uVar35 ^ 1L << (uVar30 & 0x3f);
            } while (uVar35 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }